

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O0

void __thiscall
UnitTests::Assert::
RangeError<std::_List_iterator<long>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (Assert *this,string *msg,string *reason,_List_iterator<long> expected_first,
          _List_iterator<long> expected_last,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> got_first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> got_last,
          _List_iterator<long> indicate,ptrdiff_t expected_len,ptrdiff_t got_len)

{
  ulong uVar1;
  ostream *poVar2;
  string local_220 [32];
  _List_node_base *local_200;
  int *local_1f8;
  int *local_1f0;
  _List_node_base *local_1e8;
  _List_node_base *local_1e0;
  expected_got_outputter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c8;
  ostringstream local_1c0 [8];
  ostringstream s;
  string *reason_local;
  string *msg_local;
  Assert *this_local;
  _List_iterator<long> indicate_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> got_last_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> got_first_local;
  _List_iterator<long> expected_last_local;
  _List_iterator<long> expected_first_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1c0);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_1c8 = stream<std::__cxx11::string>(msg);
    poVar2 = details::operator<<((ostream *)local_1c0,&local_1c8);
    std::operator<<(poVar2," ");
  }
  poVar2 = std::operator<<((ostream *)local_1c0,"Expected range [");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,expected_len);
  poVar2 = std::operator<<(poVar2,"] different");
  poVar2 = std::operator<<(poVar2,(string *)reason);
  poVar2 = std::operator<<(poVar2," to actual range [");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,got_len);
  std::operator<<(poVar2,"]\n");
  local_1f8 = got_last._M_current;
  local_200 = indicate._M_node;
  local_1f0 = got_first._M_current;
  local_1e8 = expected_last._M_node;
  local_1e0 = expected_first._M_node;
  OutputRange<std::_List_iterator<long>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((ostream *)local_1c0,expected_first,expected_last,got_first,got_last,indicate);
  std::__cxx11::ostringstream::str();
  Error(this,local_220);
}

Assistant:

[[noreturn]] void RangeError(const std::string& msg, const std::string& reason, ExpectedIt expected_first,
            ExpectedIt expected_last, GotIterator got_first, GotIterator got_last, ExpectedIt indicate,
            ptrdiff_t expected_len, ptrdiff_t got_len) const {
            auto s = std::ostringstream{};
            if (!msg.empty())
            {
                s << stream(msg) << " ";
            }
            s << "Expected range [" << expected_len << "] different" << reason << " to actual range [" << got_len
              << "]\n";
            OutputRange(s, expected_first, expected_last, got_first, got_last, indicate);
            Error(s.str());
        }